

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTDMT_bufferPool * ZSTDMT_createBufferPool(uint nbWorkers,ZSTD_customMem cMem)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)ZSTD_calloc((ulong)(nbWorkers * 2 + 2) * 0x10 + 0x60,cMem);
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      __mutex[1].__align = 0x10000;
      *(uint *)((long)__mutex + 0x30) = nbWorkers * 2 + 3;
      *(undefined4 *)((long)__mutex + 0x34) = 0;
      *(ZSTD_allocFunction *)((long)__mutex + 0x38) = cMem.customAlloc;
      *(ZSTD_freeFunction *)((long)__mutex + 0x40) = cMem.customFree;
      *(void **)((long)__mutex + 0x48) = cMem.opaque;
      return (ZSTDMT_bufferPool *)__mutex;
    }
    if (cMem.customFree == (ZSTD_freeFunction)0x0) {
      free(__mutex);
    }
    else {
      (*cMem.customFree)(cMem.opaque,__mutex);
    }
  }
  return (ZSTDMT_bufferPool *)0x0;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_createBufferPool(unsigned nbWorkers, ZSTD_customMem cMem)
{
    unsigned const maxNbBuffers = 2*nbWorkers + 3;
    ZSTDMT_bufferPool* const bufPool = (ZSTDMT_bufferPool*)ZSTD_calloc(
        sizeof(ZSTDMT_bufferPool) + (maxNbBuffers-1) * sizeof(buffer_t), cMem);
    if (bufPool==NULL) return NULL;
    if (ZSTD_pthread_mutex_init(&bufPool->poolMutex, NULL)) {
        ZSTD_free(bufPool, cMem);
        return NULL;
    }
    bufPool->bufferSize = 64 KB;
    bufPool->totalBuffers = maxNbBuffers;
    bufPool->nbBuffers = 0;
    bufPool->cMem = cMem;
    return bufPool;
}